

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O3

bool glu::TextureTestUtil::verifyTextureResult
               (TestContext *testCtx,ConstPixelBufferAccess *result,Texture2DArrayView *src,
               float *texCoord,ReferenceParams *sampleParams,LookupPrecision *lookupPrec,
               LodPrecision *lodPrec,PixelFormat *pixelFormat)

{
  ostringstream *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  TextureFormat this_00;
  int iVar4;
  Surface *pSVar5;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  ChannelOrder __fd;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  Surface reference;
  Surface errorMask;
  LogImage local_240;
  undefined1 local_1b0 [32];
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_138 [264];
  
  this_00 = (TextureFormat)testCtx->m_log;
  tcu::Surface::Surface(&reference,(result->m_size).m_data[0],(result->m_size).m_data[1]);
  tcu::Surface::Surface(&errorMask,(result->m_size).m_data[0],(result->m_size).m_data[1]);
  tcu::SurfaceAccess::SurfaceAccess((SurfaceAccess *)local_1b0,&reference,pixelFormat);
  sampleTexture((SurfaceAccess *)local_1b0,src,texCoord,sampleParams);
  local_240.m_name._M_dataplus._M_p = (char *)0x300000008;
  if (reference.m_pixels.m_cap != 0) {
    reference.m_pixels.m_cap = (size_t)reference.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_240,reference.m_width,
             reference.m_height,1,(void *)reference.m_pixels.m_cap);
  local_2f8._M_dataplus._M_p = (pointer)0x300000008;
  if (errorMask.m_pixels.m_cap != 0) {
    errorMask.m_pixels.m_cap = (size_t)errorMask.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_240,(TextureFormat *)&local_2f8,errorMask.m_width,
             errorMask.m_height,1,(void *)errorMask.m_pixels.m_cap);
  iVar4 = computeTextureLookupDiff
                    (result,(ConstPixelBufferAccess *)local_1b0,(PixelBufferAccess *)&local_240,src,
                     texCoord,sampleParams,lookupPrec,lodPrec,testCtx->m_watchDog);
  if (0 < iVar4) {
    this = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = this_00;
    std::__cxx11::ostringstream::ostringstream(this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this,"ERROR: Result verification failed, got ",0x27);
    std::ostream::operator<<(this,iVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," invalid pixels!",0x10);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this);
    std::ios_base::~ios_base(local_138);
  }
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"VerifyResult","");
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"Verification result","");
  tcu::LogImageSet::LogImageSet((LogImageSet *)&local_240,&local_2f8,&local_2d8);
  tcu::TestLog::startImageSet
            ((TestLog *)this_00,local_240.m_name._M_dataplus._M_p,
             local_240.m_description._M_dataplus._M_p);
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"Rendered","");
  paVar1 = &local_298.field_2;
  local_298._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"Rendered image","");
  tcu::LogImage::LogImage
            ((LogImage *)local_1b0,&local_2b8,&local_298,result,QP_IMAGE_COMPRESSION_MODE_BEST);
  __fd = this_00.order;
  tcu::LogImage::write((LogImage *)local_1b0,__fd,__buf,(size_t)result);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_p != local_180) {
    operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
  }
  if (local_1b0._0_8_ != (long)local_1b0 + 0x10) {
    operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar1) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_240.m_description.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240.m_description._M_dataplus._M_p != paVar2) {
    operator_delete(local_240.m_description._M_dataplus._M_p,
                    local_240.m_description.field_2._M_allocated_capacity + 1);
  }
  paVar3 = &local_240.m_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240.m_name._M_dataplus._M_p != paVar3) {
    operator_delete(local_240.m_name._M_dataplus._M_p,
                    local_240.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (0 < iVar4) {
    local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"Reference","");
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"Ideal reference image","")
    ;
    pSVar5 = &reference;
    tcu::LogImage::LogImage
              ((LogImage *)local_1b0,&local_2f8,&local_2d8,pSVar5,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_1b0,__fd,__buf_00,(size_t)pSVar5);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"ErrorMask","");
    local_298._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"Error mask","");
    pSVar5 = &errorMask;
    tcu::LogImage::LogImage(&local_240,&local_2b8,&local_298,pSVar5,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_240,__fd,__buf_01,(size_t)pSVar5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.m_description._M_dataplus._M_p != paVar2) {
      operator_delete(local_240.m_description._M_dataplus._M_p,
                      local_240.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.m_name._M_dataplus._M_p != paVar3) {
      operator_delete(local_240.m_name._M_dataplus._M_p,
                      local_240.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_p != local_180) {
      operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
    }
    if (local_1b0._0_8_ != (long)local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
  }
  tcu::TestLog::endImageSet((TestLog *)this_00);
  tcu::Surface::~Surface(&errorMask);
  tcu::Surface::~Surface(&reference);
  return iVar4 == 0;
}

Assistant:

bool verifyTextureResult (tcu::TestContext&						testCtx,
						  const tcu::ConstPixelBufferAccess&	result,
						  const tcu::Texture2DArrayView&		src,
						  const float*							texCoord,
						  const ReferenceParams&				sampleParams,
						  const tcu::LookupPrecision&			lookupPrec,
						  const tcu::LodPrecision&				lodPrec,
						  const tcu::PixelFormat&				pixelFormat)
{
	tcu::TestLog&	log				= testCtx.getLog();
	tcu::Surface	reference		(result.getWidth(), result.getHeight());
	tcu::Surface	errorMask		(result.getWidth(), result.getHeight());
	int				numFailedPixels;

	DE_ASSERT(getCompareMask(pixelFormat) == lookupPrec.colorMask);

	sampleTexture(tcu::SurfaceAccess(reference, pixelFormat), src, texCoord, sampleParams);
	numFailedPixels = computeTextureLookupDiff(result, reference.getAccess(), errorMask.getAccess(), src, texCoord, sampleParams, lookupPrec, lodPrec, testCtx.getWatchDog());

	if (numFailedPixels > 0)
		log << tcu::TestLog::Message << "ERROR: Result verification failed, got " << numFailedPixels << " invalid pixels!" << tcu::TestLog::EndMessage;

	log << tcu::TestLog::ImageSet("VerifyResult", "Verification result")
		<< tcu::TestLog::Image("Rendered", "Rendered image", result);

	if (numFailedPixels > 0)
	{
		log << tcu::TestLog::Image("Reference", "Ideal reference image", reference)
			<< tcu::TestLog::Image("ErrorMask", "Error mask", errorMask);
	}

	log << tcu::TestLog::EndImageSet;

	return numFailedPixels == 0;
}